

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::CheckerInstantiationSyntax::CheckerInstantiationSyntax
          (CheckerInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,NameSyntax *type,
          ParameterValueAssignmentSyntax *parameters,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  NameSyntax *pNVar4;
  HierarchicalInstanceSyntax *pHVar5;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  iterator __begin2;
  
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,CheckerInstantiation,attributes);
  __begin2.list = (ParentList *)type;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->type,(NameSyntax **)&__begin2);
  this->parameters = parameters;
  SVar2 = (instances->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(instances->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent =
       (instances->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->instances).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->instances).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->instances).super_SyntaxListBase.childCount = (instances->super_SyntaxListBase).childCount;
  (this->instances).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00470428
  ;
  sVar1 = (instances->elements).size_;
  (this->instances).elements.data_ = (instances->elements).data_;
  (this->instances).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  pNVar4 = not_null<slang::syntax::NameSyntax_*>::get(&this->type);
  (pNVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->parameters != (ParameterValueAssignmentSyntax *)0x0) {
    (this->parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __begin2.index = 0;
  sVar1 = (this->instances).elements.size_;
  __begin2.list = &this->instances;
  for (; (__begin2.list != &this->instances || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    pHVar5 = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
             iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>::operator*(&__begin2);
    (pHVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

CheckerInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NameSyntax& type, ParameterValueAssignmentSyntax* parameters, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::CheckerInstantiation, attributes), type(&type), parameters(parameters), instances(instances), semi(semi) {
        this->type->parent = this;
        if (this->parameters) this->parameters->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }